

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3.cpp
# Opt level: O1

KBOOL __thiscall KDIS::DATA_TYPE::IFF_Layer3::operator==(IFF_Layer3 *this,IFF_Layer3 *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  StandardVariable *pSVar3;
  pointer pKVar4;
  KBOOL KVar5;
  pointer pKVar6;
  StandardVariable **ppSVar7;
  
  KVar5 = LayerHeader::operator!=(&this->super_LayerHeader,&Value->super_LayerHeader);
  if ((!KVar5) &&
     (KVar5 = SimulationIdentifier::operator!=(&this->m_RptSim,&Value->m_RptSim), !KVar5)) {
    pKVar1 = (this->m_vStdVarRecs).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pKVar2 = (this->m_vStdVarRecs).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pKVar6 = (Value->m_vStdVarRecs).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pKVar2 - (long)pKVar1 ==
        (long)(Value->m_vStdVarRecs).
              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar6) {
      if (pKVar1 == pKVar2) {
        return pKVar1 == pKVar2;
      }
      if (pKVar1->m_pRef == pKVar6->m_pRef) {
        ppSVar7 = &pKVar6[1].m_pRef;
        do {
          pKVar6 = pKVar1 + 1;
          if (pKVar6 == pKVar2) {
            return pKVar6 == pKVar2;
          }
          pKVar4 = pKVar1 + 1;
          pSVar3 = *ppSVar7;
          ppSVar7 = ppSVar7 + 3;
          pKVar1 = pKVar6;
        } while (pKVar4->m_pRef == pSVar3);
        return false;
      }
    }
  }
  return false;
}

Assistant:

KBOOL IFF_Layer3::operator == ( const IFF_Layer3 & Value ) const
{
    if( LayerHeader::operator !=( Value ) )            return false;    
    if( m_RptSim              != Value.m_RptSim )      return false;
    if( m_vStdVarRecs         != Value.m_vStdVarRecs ) return false;
    return true;
}